

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relative_location_path
          (xpath_parser *this,xpath_ast_node *set)

{
  lexeme_t lVar1;
  xpath_ast_node *pxVar2;
  xpath_ast_node *set_00;
  
  pxVar2 = parse_step(this,set);
  if (pxVar2 != (xpath_ast_node *)0x0) {
    do {
      lVar1 = (this->_lexer)._cur_lexeme;
      if (lVar1 == lex_double_slash) {
        xpath_lexer::next(&this->_lexer);
        set_00 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (set_00 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        set_00->_type = '8';
        set_00->_rettype = '\x01';
        set_00->_axis = '\x05';
        set_00->_test = '\x02';
        set_00->_left = pxVar2;
        set_00->_right = (xpath_ast_node *)0x0;
        set_00->_next = (xpath_ast_node *)0x0;
        (set_00->_data).string = (char_t *)0x0;
      }
      else {
        if (lVar1 != lex_slash) {
          return pxVar2;
        }
        xpath_lexer::next(&this->_lexer);
        set_00 = pxVar2;
      }
      pxVar2 = parse_step(this,set_00);
    } while (pxVar2 != (xpath_ast_node *)0x0);
  }
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_relative_location_path(xpath_ast_node* set)
		{
			xpath_ast_node* n = parse_step(set);
			if (!n) return 0;

			while (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				if (l == lex_double_slash)
				{
					n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
					if (!n) return 0;
				}

				n = parse_step(n);
				if (!n) return 0;
			}

			return n;
		}